

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeGeneratorPrototype
               (DynamicObject *generatorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  DynamicObject **ppDVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptFunction *pJVar3;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *generatorPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,generatorPrototype,mode,5,0);
  this = RecyclableObject::GetLibrary(&generatorPrototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).generatorFunctionPrototype);
  AddMember(this,generatorPrototype,0x67,*ppDVar2,'\x02');
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<10ul>(this,(char16 (*) [10])0x1784f70);
    AddMember(this,generatorPrototype,0x1b,value,'\x02');
  }
  pJVar3 = EnsureGeneratorReturnFunction(this);
  AddMember(this,generatorPrototype,0x135,pJVar3,'\x06');
  pJVar3 = EnsureGeneratorNextFunction(this);
  AddMember(this,generatorPrototype,0x107,pJVar3,'\x06');
  pJVar3 = EnsureGeneratorThrowFunction(this);
  AddMember(this,generatorPrototype,0x16a,pJVar3,'\x06');
  DynamicObject::SetHasNoEnumerableProperties(generatorPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorPrototype(DynamicObject* generatorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorPrototype, mode, 5);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterGenerator
        // so that the update is in sync with profiler
        JavascriptLibrary* library = generatorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();

        library->AddMember(generatorPrototype, PropertyIds::constructor, library->generatorFunctionPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled()) {
            library->AddMember(generatorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Generator")), PropertyConfigurable);
        }
        library->AddMember(generatorPrototype, PropertyIds::return_, library->EnsureGeneratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(generatorPrototype, PropertyIds::next, library->EnsureGeneratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(generatorPrototype, PropertyIds::throw_, library->EnsureGeneratorThrowFunction(), PropertyBuiltInMethodDefaults);

        generatorPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }